

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryTexture(AssbinExport *this,IOStream *container,aiTexture *tex)

{
  undefined1 local_58 [8];
  AssbinChunkWriter chunk;
  aiTexture *tex_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)tex;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x1236,0x1000);
  Write<unsigned_int>((IOStream *)local_58,(uint *)chunk.initial);
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 4));
  AssbinChunkWriter::Write((AssbinChunkWriter *)local_58,(void *)(chunk.initial + 8),1,4);
  if ((this->shortened & 1U) == 0) {
    if (*(int *)(chunk.initial + 4) == 0) {
      AssbinChunkWriter::Write
                ((AssbinChunkWriter *)local_58,*(void **)(chunk.initial + 0x18),1,
                 (ulong)*(uint *)chunk.initial);
    }
    else {
      AssbinChunkWriter::Write
                ((AssbinChunkWriter *)local_58,*(void **)(chunk.initial + 0x18),1,
                 (ulong)(uint)(*(int *)chunk.initial * *(int *)(chunk.initial + 4) * 4));
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryTexture(IOStream * container, const aiTexture* tex)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AITEXTURE );

        Write<unsigned int>(&chunk,tex->mWidth);
        Write<unsigned int>(&chunk,tex->mHeight);
        chunk.Write( tex->achFormatHint, sizeof(char), 4 );

        if(!shortened) {
            if (!tex->mHeight) {
                chunk.Write(tex->pcData,1,tex->mWidth);
            }
            else {
                chunk.Write(tex->pcData,1,tex->mWidth*tex->mHeight*4);
            }
        }

    }